

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O0

void __thiscall DSectorScrollInterpolation::Destroy(DSectorScrollInterpolation *this)

{
  DSectorScrollInterpolation *this_local;
  
  if (this->sector != (sector_t_conflict *)0x0) {
    if ((this->ceiling & 1U) == 0) {
      TObjPtr<DInterpolation>::operator=(this->sector->interpolations + 3,(DInterpolation *)0x0);
    }
    else {
      TObjPtr<DInterpolation>::operator=(this->sector->interpolations + 2,(DInterpolation *)0x0);
    }
    this->sector = (sector_t_conflict *)0x0;
  }
  DInterpolation::Destroy(&this->super_DInterpolation);
  return;
}

Assistant:

void DSectorScrollInterpolation::Destroy()
{
	if (sector != nullptr)
	{
		if (ceiling)
		{
			sector->interpolations[sector_t::CeilingScroll] = nullptr;
		}
		else
		{
			sector->interpolations[sector_t::FloorScroll] = nullptr;
		}
		sector = nullptr;
	}
	Super::Destroy();
}